

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketcan-cyclic-demo.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__src;
  int iVar1;
  int iVar2;
  __sighandler_t p_Var3;
  int *piVar4;
  ssize_t sVar5;
  ulong uVar6;
  can_frame *frame;
  can_msg msg;
  ifreq ifr;
  sockaddr_can addr;
  char *iface;
  int s;
  int opt;
  uint i;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    fputs("Too few arguments!\n",_stderr);
    usage();
    argv_local._4_4_ = 1;
  }
  else {
    iVar1 = getopt(argc,argv,"hv");
    if (iVar1 == -1) {
      if (_optind == argc + -1) {
        __src = argv[_optind];
        p_Var3 = signal(2,onsig);
        if (((p_Var3 != (__sighandler_t)0xffffffffffffffff) &&
            (p_Var3 = signal(0xf,onsig), p_Var3 != (__sighandler_t)0xffffffffffffffff)) &&
           (p_Var3 = signal(0x11,(__sighandler_t)0x1), p_Var3 != (__sighandler_t)0xffffffffffffffff)
           ) {
          iVar1 = socket(0x1d,2,2);
          if (iVar1 < 0) {
            perror("socketcan-bcm-demo: socket");
            piVar4 = __errno_location();
            return *piVar4;
          }
          strncpy((char *)msg.frame[3].data,__src,0x10);
          iVar2 = ioctl(iVar1,0x8933,msg.frame[3].data);
          if (iVar2 < 0) {
            perror("socketcan-bcm-demo: ioctl");
            piVar4 = __errno_location();
            return *piVar4;
          }
          ifr.ifr_ifru.ifru_map.base_addr = 0x1d;
          ifr.ifr_ifru._20_4_ = ifr.ifr_ifrn._8_4_;
          iVar2 = connect(iVar1,(sockaddr *)((long)&ifr.ifr_ifru + 0x10),0x18);
          if (iVar2 < 0) {
            perror("socketcan-bcm-demo: connect");
            piVar4 = __errno_location();
            return *piVar4;
          }
          sigval = 0;
          frame._0_4_ = 1;
          msg.msg_head.ival2.tv_usec._0_4_ = 0;
          frame._4_4_ = 3;
          msg.msg_head.ival2.tv_usec._4_4_ = 4;
          msg.msg_head.opcode = 0;
          msg.msg_head.ival1.tv_usec = 1;
          msg.msg_head.ival2.tv_sec = 200000;
          for (s = 0; (uint)s < 4; s = s + 1) {
            uVar6 = (ulong)(uint)s;
            *(int *)msg.frame[uVar6 - 1].data = s + 0xc0;
            msg.frame[uVar6 - 1].data[4] = '\x03';
            memset(msg.frame + uVar6,s & 0xff,3);
          }
          sVar5 = write(iVar1,&frame,0x78);
          if (sVar5 < 0) {
            perror("socketcan-bcm-demo: write: TX_SETUP");
            piVar4 = __errno_location();
            return *piVar4;
          }
          printf("Cyclic messages registed with SocketCAN!\nUse a tool such as \"candump %s\" to view the messages.\nThese messages will continue to transmit so long as the socket\nused to communicate with SocketCAN remains open. In other words,\nclose this program with SIGINT or SIGTERM in order to gracefully\nstop transmitting.\n"
                 ,__src);
          while (sigval == 0) {
            usleep(10000);
          }
          puts("\nGoodbye!");
          iVar1 = close(iVar1);
          if (iVar1 < 0) {
            perror("socketcan-bcm-demo: close");
            piVar4 = __errno_location();
            return *piVar4;
          }
          return 0;
        }
        perror("socketcan-bcm-demo");
        piVar4 = __errno_location();
        argv_local._4_4_ = *piVar4;
      }
      else {
        fputs("Only one interface may be used!\n",_stderr);
        usage();
        argv_local._4_4_ = 1;
      }
    }
    else if (iVar1 == 0x68) {
      usage();
      argv_local._4_4_ = 0;
    }
    else if (iVar1 == 0x76) {
      version();
      argv_local._4_4_ = 0;
    }
    else {
      usage();
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    unsigned int i;
    int opt;
    int s;
    char *iface;
    struct sockaddr_can addr;
    struct ifreq ifr;
    
    struct can_msg
    {
        struct bcm_msg_head msg_head;
        struct can_frame frame[NFRAMES];
    } msg;

    /* Check if at least one argument was specified */
    if (argc < 2)
    {
        fputs("Too few arguments!\n", stderr);
        usage();
        return EXIT_FAILURE;
    }

    /* Parse command line options */
    while ((opt = getopt(argc, argv, "hv")) != -1)
    {
        switch (opt)
        {
        case 'h':
            usage();
            return EXIT_SUCCESS;
        case 'v':
            version();
            return EXIT_SUCCESS;
        default:
            usage();
            return EXIT_FAILURE;
        }
    }

    /* Exactly one command line argument must remain; the interface to use */
    if (optind == (argc - 1))
    {
        iface = argv[optind];
    }
    else
    {
        fputs("Only one interface may be used!\n", stderr);
        usage();
        return EXIT_FAILURE;
    }

    /* Register signal handlers */
    if (signal(SIGINT, onsig)    == SIG_ERR ||
        signal(SIGTERM, onsig)   == SIG_ERR ||
        signal(SIGCHLD, SIG_IGN) == SIG_ERR)
    {
        perror(PROGNAME);
        return errno;
    }

    /* Open the CAN interface */
    s = socket(PF_CAN, SOCK_DGRAM, CAN_BCM);
    if (s < 0)
    {
        perror(PROGNAME ": socket");
        return errno;
    }

    strncpy(ifr.ifr_name, iface, IFNAMSIZ);
    if (ioctl(s, SIOCGIFINDEX, &ifr) < 0)
    {
        perror(PROGNAME ": ioctl");
        return errno;
    }

    addr.can_family = AF_CAN;
    addr.can_ifindex = ifr.ifr_ifindex;
    if (connect(s, (struct sockaddr *)&addr, sizeof(addr)) < 0)
    {
        perror(PROGNAME ": connect");
        return errno;
    }

    /* Setup code */
    sigval = 0;

    /* Set up cyclic messages. Note that both SETTIMER and STARTTIMER are
     * required as flags in order to continue transmitting.
     */
    msg.msg_head.opcode  = TX_SETUP;
    msg.msg_head.can_id  = 0;
    msg.msg_head.flags   = SETTIMER | STARTTIMER;
    msg.msg_head.nframes = NFRAMES;
    msg.msg_head.count   = 0;

    /* Set the time interval value to 1200 ms */
    msg.msg_head.ival2.tv_sec = 1;
    msg.msg_head.ival2.tv_usec = 200000;

    /* Create the example messages */
    for (i = 0; i < NFRAMES; ++i)
    {
        struct can_frame * const frame = msg.frame + i;
        frame->can_id = MSGID + i;
        frame->can_dlc = MSGLEN;
        memset(frame->data, i, MSGLEN);
    }

    /* Register the cyclic messages. Note that all of the messages in the msg
     * struct will be sent with the same periodicity because they share the
     * same bcm_msg_head setup data.
     */
    if (write(s, &msg, sizeof(msg)) < 0)
    {
        perror(PROGNAME ": write: TX_SETUP");
        return errno;
    }

    printf("Cyclic messages registed with SocketCAN!\n"
           "Use a tool such as \"candump %s\" to view the messages.\n"
           "These messages will continue to transmit so long as the socket\n"
           "used to communicate with SocketCAN remains open. In other words,\n"
           "close this program with SIGINT or SIGTERM in order to gracefully\n"
           "stop transmitting.\n",
           iface);

    /* Spin forever here */
    while (0 == sigval) usleep(DELAY);

    puts("\nGoodbye!");

    /* Close the CAN interface */
    if (close(s) < 0)
    {
        perror(PROGNAME ": close");
        return errno;
    }

    return EXIT_SUCCESS;
}